

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::LoadIniSettingsFromMemory(char *ini_data,size_t ini_size)

{
  int *piVar1;
  int iVar2;
  char *pcVar3;
  code *pcVar4;
  char *pcVar5;
  ImGuiContext *pIVar6;
  char *pcVar7;
  undefined1 *puVar8;
  void *pvVar9;
  ImGuiSettingsHandler *pIVar10;
  void *pvVar11;
  ImGuiContext *ctx;
  int iVar12;
  char *pcVar13;
  long lVar14;
  int iVar15;
  long lVar16;
  
  pIVar6 = GImGui;
  if (ini_size == 0) {
    ini_size = strlen(ini_data);
  }
  iVar12 = (int)ini_size + 1;
  iVar2 = (pIVar6->SettingsIniData).Buf.Capacity;
  if (iVar2 <= (int)ini_size) {
    if (iVar2 == 0) {
      iVar15 = 8;
    }
    else {
      iVar15 = iVar2 / 2 + iVar2;
    }
    if (iVar15 <= iVar12) {
      iVar15 = iVar12;
    }
    if (iVar2 < iVar15) {
      if (pIVar6 != (ImGuiContext *)0x0) {
        piVar1 = &(pIVar6->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pcVar7 = (char *)(*GImAllocatorAllocFunc)((long)iVar15,GImAllocatorUserData);
      pcVar3 = (pIVar6->SettingsIniData).Buf.Data;
      if (pcVar3 != (char *)0x0) {
        memcpy(pcVar7,pcVar3,(long)(pIVar6->SettingsIniData).Buf.Size);
        pcVar3 = (pIVar6->SettingsIniData).Buf.Data;
        if ((pcVar3 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pcVar3,GImAllocatorUserData);
      }
      (pIVar6->SettingsIniData).Buf.Data = pcVar7;
      (pIVar6->SettingsIniData).Buf.Capacity = iVar15;
    }
  }
  (pIVar6->SettingsIniData).Buf.Size = iVar12;
  pcVar3 = (pIVar6->SettingsIniData).Buf.Data;
  memcpy(pcVar3,ini_data,ini_size);
  pcVar3[ini_size] = '\0';
  if (0 < (pIVar6->SettingsHandlers).Size) {
    lVar14 = 0;
    lVar16 = 0;
    do {
      pIVar10 = (pIVar6->SettingsHandlers).Data;
      pcVar4 = *(code **)((long)&pIVar10->ReadInitFn + lVar14);
      if (pcVar4 != (code *)0x0) {
        (*pcVar4)(pIVar6,(long)&pIVar10->TypeName + lVar14);
      }
      lVar16 = lVar16 + 1;
      lVar14 = lVar14 + 0x48;
    } while (lVar16 < (pIVar6->SettingsHandlers).Size);
  }
  if (0 < (long)ini_size) {
    pvVar11 = (void *)0x0;
    pIVar10 = (ImGuiSettingsHandler *)0x0;
    pcVar7 = pcVar3;
    do {
      pcVar13 = pcVar7 + 2;
      for (; (*pcVar7 == '\n' || (pcVar5 = pcVar7, *pcVar7 == '\r')); pcVar7 = pcVar7 + 1) {
        pcVar13 = pcVar13 + 1;
      }
      for (; ((pcVar5 < pcVar3 + ini_size && (*pcVar5 != '\n')) && (*pcVar5 != '\r'));
          pcVar5 = pcVar5 + 1) {
      }
      *pcVar5 = '\0';
      if (*pcVar7 != ';') {
        if (((*pcVar7 == '[') && (pcVar7 < pcVar5)) && (pcVar5[-1] == ']')) {
          pcVar5[-1] = '\0';
          puVar8 = (undefined1 *)memchr(pcVar7 + 1,0x5d,(long)pcVar5 - (long)pcVar13);
          if ((puVar8 != (undefined1 *)0x0) &&
             (pvVar9 = memchr(puVar8 + 1,0x5b,(size_t)(pcVar5 + (-1 - (long)(puVar8 + 1)))),
             pvVar9 != (void *)0x0)) {
            *puVar8 = 0;
            pIVar10 = FindSettingsHandler(pcVar7 + 1);
            if (pIVar10 == (ImGuiSettingsHandler *)0x0) {
              pvVar11 = (void *)0x0;
            }
            else {
              pvVar11 = (*pIVar10->ReadOpenFn)(pIVar6,pIVar10,(char *)((long)pvVar9 + 1));
            }
          }
        }
        else if ((pIVar10 != (ImGuiSettingsHandler *)0x0) && (pvVar11 != (void *)0x0)) {
          (*pIVar10->ReadLineFn)(pIVar6,pIVar10,pvVar11,pcVar7);
        }
      }
      pcVar7 = pcVar5 + 1;
    } while (pcVar7 < pcVar3 + ini_size);
  }
  pIVar6->SettingsLoaded = true;
  memcpy(pcVar3,ini_data,ini_size);
  if (0 < (pIVar6->SettingsHandlers).Size) {
    lVar14 = 0;
    lVar16 = 0;
    do {
      pIVar10 = (pIVar6->SettingsHandlers).Data;
      pcVar4 = *(code **)((long)&pIVar10->ApplyAllFn + lVar14);
      if (pcVar4 != (code *)0x0) {
        (*pcVar4)(pIVar6,(long)&pIVar10->TypeName + lVar14);
      }
      lVar16 = lVar16 + 1;
      lVar14 = lVar14 + 0x48;
    } while (lVar16 < (pIVar6->SettingsHandlers).Size);
  }
  return;
}

Assistant:

void ImGui::LoadIniSettingsFromMemory(const char* ini_data, size_t ini_size)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    //IM_ASSERT(!g.WithinFrameScope && "Cannot be called between NewFrame() and EndFrame()");
    //IM_ASSERT(g.SettingsLoaded == false && g.FrameCount == 0);

    // For user convenience, we allow passing a non zero-terminated string (hence the ini_size parameter).
    // For our convenience and to make the code simpler, we'll also write zero-terminators within the buffer. So let's create a writable copy..
    if (ini_size == 0)
        ini_size = strlen(ini_data);
    g.SettingsIniData.Buf.resize((int)ini_size + 1);
    char* const buf = g.SettingsIniData.Buf.Data;
    char* const buf_end = buf + ini_size;
    memcpy(buf, ini_data, ini_size);
    buf_end[0] = 0;

    // Call pre-read handlers
    // Some types will clear their data (e.g. dock information) some types will allow merge/override (window)
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
        if (g.SettingsHandlers[handler_n].ReadInitFn)
            g.SettingsHandlers[handler_n].ReadInitFn(&g, &g.SettingsHandlers[handler_n]);

    void* entry_data = NULL;
    ImGuiSettingsHandler* entry_handler = NULL;

    char* line_end = NULL;
    for (char* line = buf; line < buf_end; line = line_end + 1)
    {
        // Skip new lines markers, then find end of the line
        while (*line == '\n' || *line == '\r')
            line++;
        line_end = line;
        while (line_end < buf_end && *line_end != '\n' && *line_end != '\r')
            line_end++;
        line_end[0] = 0;
        if (line[0] == ';')
            continue;
        if (line[0] == '[' && line_end > line && line_end[-1] == ']')
        {
            // Parse "[Type][Name]". Note that 'Name' can itself contains [] characters, which is acceptable with the current format and parsing code.
            line_end[-1] = 0;
            const char* name_end = line_end - 1;
            const char* type_start = line + 1;
            char* type_end = (char*)(void*)ImStrchrRange(type_start, name_end, ']');
            const char* name_start = type_end ? ImStrchrRange(type_end + 1, name_end, '[') : NULL;
            if (!type_end || !name_start)
                continue;
            *type_end = 0; // Overwrite first ']'
            name_start++;  // Skip second '['
            entry_handler = FindSettingsHandler(type_start);
            entry_data = entry_handler ? entry_handler->ReadOpenFn(&g, entry_handler, name_start) : NULL;
        }
        else if (entry_handler != NULL && entry_data != NULL)
        {
            // Let type handler parse the line
            entry_handler->ReadLineFn(&g, entry_handler, entry_data, line);
        }
    }
    g.SettingsLoaded = true;

    // [DEBUG] Restore untouched copy so it can be browsed in Metrics (not strictly necessary)
    memcpy(buf, ini_data, ini_size);

    // Call post-read handlers
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
        if (g.SettingsHandlers[handler_n].ApplyAllFn)
            g.SettingsHandlers[handler_n].ApplyAllFn(&g, &g.SettingsHandlers[handler_n]);
}